

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# object.cpp
# Opt level: O3

bool __thiscall Am_Object::Is_Instance_Of(Am_Object *this,Am_Object *in_prototype)

{
  Am_Object_Data *pAVar1;
  bool bVar2;
  
  pAVar1 = this->data;
  if (pAVar1 == (Am_Object_Data *)0x0) {
    return false;
  }
  do {
    bVar2 = pAVar1 == in_prototype->data;
    if (bVar2) {
      return bVar2;
    }
    pAVar1 = pAVar1->prototype;
  } while (pAVar1 != (Am_Object_Data *)0x0);
  return bVar2;
}

Assistant:

bool
Am_Object::Is_Instance_Of(Am_Object in_prototype) const
{
  Am_Object_Data *current = data;
  while (current) {
    if (current == in_prototype.data)
      return true;
    current = current->prototype;
  }
  return false;
}